

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  uint uVar6;
  char cVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int32_t *piVar13;
  int iVar14;
  float fVar15;
  long lVar16;
  ushort uVar17;
  uint uVar18;
  float fVar19;
  void *pvVar20;
  uint8_t *cdata;
  float *pfVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  uint8_t *puVar26;
  long lVar27;
  
  iVar3 = (decode->chunk).height;
  uVar9 = iVar3 - decode->user_line_end_ignore;
  if (uVar9 == 0 || iVar3 < decode->user_line_end_ignore) {
    return 0;
  }
  uVar4 = (decode->chunk).width;
  iVar3 = decode->user_line_begin_skip;
  piVar13 = decode->sample_count_table;
  pvVar20 = decode->unpacked_buffer;
  sVar8 = decode->channel_count;
  uVar22 = 0;
  do {
    if (0 < sVar8) {
      peVar5 = decode->channels;
      lVar27 = 0;
      do {
        cVar1 = peVar5[lVar27].bytes_per_element;
        if (((long)uVar22 < (long)iVar3) ||
           (peVar5[lVar27].field_12.decode_to_ptr == (uint8_t *)0x0)) {
          if ((decode->decode_flags & 1) == 0) {
            iVar11 = piVar13[(long)(int)uVar4 + -1];
          }
          else if ((int)uVar4 < 1) {
            iVar11 = 0;
          }
          else {
            uVar23 = 0;
            iVar11 = 0;
            do {
              iVar11 = iVar11 + piVar13[uVar23];
              uVar23 = uVar23 + 1;
            } while (uVar4 != uVar23);
          }
          pvVar20 = (void *)((long)pvVar20 + (long)iVar11 * (long)cVar1);
        }
        else if (0 < (int)uVar4) {
          lVar24 = (long)peVar5[lVar27].user_bytes_per_element;
          iVar11 = peVar5[lVar27].user_pixel_stride;
          puVar26 = peVar5[lVar27].field_12.decode_to_ptr +
                    ((ulong)(long)peVar5[lVar27].user_line_stride >> 3) * (uVar22 - (long)iVar3) * 8
          ;
          uVar23 = 0;
          iVar25 = 0;
          do {
            pfVar21 = *(float **)puVar26;
            iVar14 = iVar25;
            iVar10 = piVar13[uVar23];
            if ((decode->decode_flags & 1) != 0) {
              iVar14 = 0;
              iVar10 = iVar25;
            }
            iVar25 = iVar10;
            iVar14 = piVar13[uVar23] - iVar14;
            if (pfVar21 != (float *)0x0) {
              uVar2 = peVar5[lVar27].data_type;
              if (uVar2 == 0) {
                uVar2 = peVar5[lVar27].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      *pfVar21 = (float)*(uint *)((long)pvVar20 + lVar16 * 4);
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      uVar12 = *(uint *)((long)pvVar20 + lVar16 * 4);
                      uVar17 = 0x7c00;
                      if (uVar12 < 0xffe1) {
                        fVar19 = (float)(int)uVar12;
                        if ((uint)fVar19 < 0x38800000) {
                          if ((uint)fVar19 < 0x33000001) {
                            uVar17 = 0;
                          }
                          else {
                            uVar12 = (uint)fVar19 & 0x7fffff | 0x800000;
                            cVar7 = (char)((uint)fVar19 >> 0x17);
                            uVar17 = (ushort)(uVar12 >> (0x7eU - cVar7 & 0x1f));
                            if (0x80000000 < uVar12 << (cVar7 + 0xa2U & 0x1f)) {
                              uVar17 = uVar17 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar19 < 0x7f800000) {
                          if ((uint)fVar19 < 0x477ff000) {
                            uVar17 = (ushort)((int)fVar19 + 0x8000fff +
                                              (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar19 != INFINITY) {
                          uVar12 = (uint)fVar19 >> 0xd & 0x3ff;
                          uVar17 = (ushort)(uVar12 == 0) | (ushort)uVar12 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar21 = uVar17;
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      *pfVar21 = *(float *)((long)pvVar20 + lVar16 * 4);
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
              }
              else if (uVar2 == 2) {
                uVar2 = peVar5[lVar27].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      *pfVar21 = *(float *)((long)pvVar20 + lVar16 * 4);
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      uVar12 = *(uint *)((long)pvVar20 + lVar16 * 4);
                      uVar18 = uVar12 & 0x7fffffff;
                      uVar17 = (ushort)(uVar12 >> 0x10) & 0x8000;
                      if (uVar18 < 0x38800000) {
                        if ((0x33000000 < uVar18) &&
                           (uVar12 = uVar12 & 0x7fffff | 0x800000, cVar7 = (char)(uVar18 >> 0x17),
                           uVar17 = uVar17 | (ushort)(uVar12 >> (0x7eU - cVar7 & 0x1f)),
                           0x80000000 < uVar12 << (cVar7 + 0xa2U & 0x1f))) {
                          uVar17 = uVar17 + 1;
                        }
                      }
                      else if (uVar18 < 0x7f800000) {
                        if (uVar18 < 0x477ff000) {
                          uVar17 = (ushort)(uVar18 + 0x8000fff + (uint)((uVar18 >> 0xd & 1) != 0) >>
                                           0xd) | uVar17;
                        }
                        else {
                          uVar17 = uVar17 | 0x7c00;
                        }
                      }
                      else {
                        uVar17 = uVar17 | 0x7c00;
                        if (uVar18 != 0x7f800000) {
                          uVar12 = uVar18 >> 0xd & 0x3ff;
                          uVar17 = uVar17 | (ushort)uVar12 | (ushort)(uVar12 == 0);
                        }
                      }
                      *(ushort *)pfVar21 = uVar17;
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      fVar19 = *(float *)((long)pvVar20 + lVar16 * 4);
                      fVar15 = 0.0;
                      if (0.0 <= fVar19) {
                        fVar15 = (float)(long)fVar19;
                        if (ABS(fVar19) == INFINITY) {
                          fVar15 = -NAN;
                        }
                        if (4.2949673e+09 < fVar19) {
                          fVar15 = -NAN;
                        }
                      }
                      *pfVar21 = fVar15;
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
              }
              else {
                if (uVar2 != 1) {
                  return 3;
                }
                uVar2 = peVar5[lVar27].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      uVar18 = (uint)*(short *)((long)pvVar20 + lVar16 * 2);
                      uVar12 = (uVar18 & 0x7fff) << 0xd;
                      fVar19 = (float)(uVar18 & 0x80000000);
                      if (uVar12 < 0x800000) {
                        if ((uVar18 & 0x7fff) != 0) {
                          uVar6 = 0x1f;
                          if ((uVar18 & 0x7fff) != 0) {
                            for (; uVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                            }
                          }
                          iVar10 = (uVar6 ^ 0x1f) - 8;
                          fVar19 = (float)(((uint)fVar19 | uVar12 << ((byte)iVar10 & 0x1f) |
                                           0x38800000) + iVar10 * -0x800000);
                        }
                      }
                      else if (uVar12 < 0xf800000) {
                        fVar19 = (float)(((uint)fVar19 | uVar12) + 0x38000000);
                      }
                      else {
                        fVar19 = (float)((uint)fVar19 | uVar12 | 0x7f800000);
                      }
                      *pfVar21 = fVar19;
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      *(ushort *)pfVar21 = *(ushort *)((long)pvVar20 + lVar16 * 2);
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
                else {
                  if (uVar2 != 0) {
                    return 3;
                  }
                  if (0 < iVar14) {
                    lVar16 = 0;
                    do {
                      uVar17 = *(ushort *)((long)pvVar20 + lVar16 * 2);
                      uVar12 = (uint)uVar17;
                      if ((short)uVar17 < 0) {
                        fVar19 = 0.0;
                      }
                      else if ((~uVar12 & 0x7c00) == 0) {
                        fVar19 = (float)-(uint)((uVar17 & 0x3ff) == 0);
                      }
                      else {
                        uVar18 = uVar12 * 0x2000;
                        if (uVar12 < 0x400) {
                          if (uVar17 == 0) {
                            fVar19 = 0.0;
                          }
                          else {
                            uVar6 = 0x1f;
                            if (uVar12 != 0) {
                              for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                              }
                            }
                            iVar10 = (uVar6 ^ 0x1f) - 8;
                            fVar19 = (float)((uVar18 << ((byte)iVar10 & 0x1f) | 0x38800000) +
                                            iVar10 * -0x800000);
                          }
                        }
                        else if (uVar12 < 0x7c00) {
                          fVar19 = (float)(uVar18 + 0x38000000);
                        }
                        else {
                          fVar19 = (float)(uVar18 | 0x7f800000);
                        }
                        fVar19 = (float)(long)fVar19;
                      }
                      *pfVar21 = fVar19;
                      pfVar21 = (float *)((long)pfVar21 + lVar24);
                      lVar16 = lVar16 + 1;
                    } while (iVar14 != (int)lVar16);
                  }
                }
              }
            }
            puVar26 = puVar26 + ((long)iVar11 & 0xfffffffffffffff8);
            pvVar20 = (void *)((long)pvVar20 + (long)iVar14 * (long)cVar1);
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar4);
          sVar8 = decode->channel_count;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < sVar8);
    }
    piVar13 = piVar13 + (int)uVar4;
    uVar22 = uVar22 + 1;
  } while (uVar22 != uVar9);
  return 0;
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc, uls;

    w   = decode->chunk.width;
    h   = decode->chunk.height - decode->user_line_end_ignore;
    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;
    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (y < uls || !pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y - uls) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = outpix;

                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += ((size_t) bpc) * ((size_t) samps);
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}